

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

void chaiscript::dispatch::detail::
     call_func<chaiscript::dispatch::detail::Caller<void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&>,void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,chaiscript::Boxed_Value_const&,0ul,1ul>
               (undefined8 param_1,ulong *param_2,long *param_3,Type_Conversions_State *param_4)

{
  Result_Type pvVar1;
  code *pcVar2;
  long *plVar3;
  Result_Type RVar4;
  chaiscript local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pvVar1 = boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&>
                     ((Boxed_Value *)*param_3,param_4);
  RVar4 = boxed_cast<chaiscript::Boxed_Value_const&>
                    (local_30,(Boxed_Value *)(*param_3 + 0x10),param_4);
  pcVar2 = (code *)*param_2;
  plVar3 = (long *)((long)&(pvVar1->
                           super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                           )._M_impl.super__Vector_impl_data._M_start + param_2[1]);
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *plVar3 + -1);
  }
  (*pcVar2)(plVar3,local_30,
            RVar4.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }